

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  int ret;
  long lVar2;
  char *end;
  char error_buf [200];
  char *local_e0;
  char local_d8 [200];
  
  local_e0 = argv[1];
  if (argc == 2) {
    lVar1 = strtol(local_e0,&local_e0,10);
    if (*local_e0 != '\0') {
      lVar1 = strtol(argv[1],&local_e0,0x10);
      if (*local_e0 != '\0') goto LAB_001011e1;
    }
    lVar2 = -lVar1;
    if (lVar1 < 1) {
      lVar2 = lVar1;
    }
    ret = (int)lVar2;
    if (lVar1 != 0) {
      mbedtls_strerror(ret,local_d8,200);
      printf("Last error was: -0x%04x - %s\n\n",(ulong)(uint)-ret,local_d8);
    }
  }
  else {
LAB_001011e1:
    puts(
        "\n usage: strerror <errorcode>\n\n where <errorcode> can be a decimal or hexadecimal (starts with 0x or -0x)"
        );
    ret = 0;
  }
  return ret;
}

Assistant:

int main( int argc, char *argv[] )
{
    long int val;
    char *end = argv[1];

    if( argc != 2 )
    {
        mbedtls_printf( USAGE );
        return( 0 );
    }

    val = strtol( argv[1], &end, 10 );
    if( *end != '\0' )
    {
        val = strtol( argv[1], &end, 16 );
        if( *end != '\0' )
        {
            mbedtls_printf( USAGE );
            return( 0 );
        }
    }
    if( val > 0 )
        val = -val;

    if( val != 0 )
    {
        char error_buf[200];
        mbedtls_strerror( val, error_buf, 200 );
        mbedtls_printf("Last error was: -0x%04x - %s\n\n", (int) -val, error_buf );
    }

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( val );
}